

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

IdleDecommitPageAllocator * __thiscall Memory::HeapInfo::GetRecyclerPageAllocator(HeapInfo *this)

{
  HeapInfo *this_local;
  
  this_local = (HeapInfo *)&this->recyclerWithBarrierPageAllocator;
  return (IdleDecommitPageAllocator *)this_local;
}

Assistant:

IdleDecommitPageAllocator*
HeapInfo::GetRecyclerPageAllocator()
{
    // TODO: SWB this is for Finalizable leaf allocation, which we didn't implement leaf bucket for it
    // remove this after the finalizable leaf bucket is implemented
#if GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        return &this->recyclerWithBarrierPageAllocator;
    }
    else
#endif
    {
#if defined(RECYCLER_WRITE_WATCH) || !defined(RECYCLER_WRITE_BARRIER_ALLOC_SEPARATE_PAGE)
        return &this->recyclerPageAllocator;
#else
        return &this->recyclerWithBarrierPageAllocator;
#endif
    }
}